

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O0

void __thiscall efsw::DirectorySnapshot::addFile(DirectorySnapshot *this,string *path)

{
  mapped_type *this_00;
  FileInfo local_b0;
  string local_58 [32];
  FileSystem local_38 [8];
  string name;
  string *path_local;
  DirectorySnapshot *this_local;
  
  std::__cxx11::string::string(local_58,(string *)path);
  FileSystem::fileNameFromPath(local_38,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  FileInfo::FileInfo(&local_b0,path);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
            ::operator[](&this->Files,(key_type *)local_38);
  FileInfo::operator=(this_00,&local_b0);
  FileInfo::~FileInfo(&local_b0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void DirectorySnapshot::addFile( std::string path ) {
	std::string name( FileSystem::fileNameFromPath( path ) );
	Files[name] = FileInfo( path );
}